

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::PrettyUnitTestResultPrinter::PrintSkippedTests(UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TestSuite *this;
  char *pcVar5;
  TestInfo *test_info;
  int j;
  TestSuite *test_suite;
  int i;
  int skipped_test_count;
  char *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  TestInfo *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int local_10;
  
  iVar2 = UnitTest::skipped_test_count((UnitTest *)0x13aaf3);
  if (iVar2 != 0) {
    local_10 = 0;
    while (iVar2 = local_10, iVar3 = UnitTest::total_test_suite_count((UnitTest *)0x13ab1d),
          iVar2 < iVar3) {
      this = UnitTest::GetTestSuite
                       ((UnitTest *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                        (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      bVar1 = TestSuite::should_run(this);
      if ((bVar1) && (iVar3 = TestSuite::skipped_test_count((TestSuite *)0x13ab58), iVar3 != 0)) {
        in_stack_ffffffffffffffd0 = 0;
        while (iVar3 = in_stack_ffffffffffffffd0,
              iVar4 = TestSuite::total_test_count((TestSuite *)0x13ab7c),
              in_stack_ffffffffffffffd0 < iVar4) {
          in_stack_ffffffffffffffd8 =
               TestSuite::GetTestInfo
                         ((TestSuite *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                          (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
          bVar1 = TestInfo::should_run(in_stack_ffffffffffffffd8);
          if (bVar1) {
            TestInfo::result(in_stack_ffffffffffffffd8);
            bVar1 = TestResult::Skipped((TestResult *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
            if (bVar1) {
              ColoredPrintf(kGreen,"[  SKIPPED ] ");
              in_stack_ffffffffffffffc8 = TestSuite::name((TestSuite *)0x13abe2);
              pcVar5 = TestInfo::name((TestInfo *)0x13abf0);
              printf("%s.%s",in_stack_ffffffffffffffc8,pcVar5);
              printf("\n");
            }
          }
          in_stack_ffffffffffffffd0 = iVar3 + 1;
        }
      }
      local_10 = local_10 + 1;
    }
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintSkippedTests(const UnitTest& unit_test) {
  const int skipped_test_count = unit_test.skipped_test_count();
  if (skipped_test_count == 0) {
    return;
  }

  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    const TestSuite& test_suite = *unit_test.GetTestSuite(i);
    if (!test_suite.should_run() || (test_suite.skipped_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_suite.total_test_count(); ++j) {
      const TestInfo& test_info = *test_suite.GetTestInfo(j);
      if (!test_info.should_run() || !test_info.result()->Skipped()) {
        continue;
      }
      ColoredPrintf(GTestColor::kGreen, "[  SKIPPED ] ");
      printf("%s.%s", test_suite.name(), test_info.name());
      printf("\n");
    }
  }
}